

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmpEstimation.cpp
# Opt level: O1

Vector computeZmp(Vector *forces,Matrix *sensorPosition1,Matrix *sensorPosition2,uint contactNbr)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  Vector *pVVar5;
  long lVar6;
  double *pdVar7;
  undefined8 *puVar8;
  undefined4 in_register_0000000c;
  Matrix *extraout_RDX;
  Matrix *extraout_RDX_00;
  Matrix *extraout_RDX_01;
  ActualDstType actualDst;
  ulong uVar9;
  uint in_R8D;
  ulong uVar10;
  bool bVar11;
  double dVar12;
  Vector VVar13;
  Matrix M;
  assign_op<double,_double> local_c5;
  uint local_c4;
  double local_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  Vector *local_a0;
  double *local_98;
  long local_90;
  DenseStorage<double,__1,__1,__1,_0> local_88;
  Matrix *local_70;
  ulong local_68;
  undefined8 local_60;
  long local_58;
  Matrix *local_50;
  Matrix<double,__1,__1,_0,__1,__1> *local_48;
  double *local_40;
  ulong local_38;
  
  local_48 = (Matrix<double,__1,__1,_0,__1,__1> *)CONCAT44(in_register_0000000c,contactNbr);
  (forces->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data =
       (double *)0x0;
  (forces->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows = 0;
  local_a0 = forces;
  local_50 = sensorPosition2;
  if ((forces->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows != 3
     ) {
    free((forces->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data);
    pdVar7 = (double *)malloc(0x18);
    if (((ulong)pdVar7 & 0xf) != 0) {
      __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                    ,"/usr/include/eigen3/Eigen/src/Core/util/Memory.h",0xb9,
                    "void *Eigen::internal::aligned_malloc(std::size_t)");
    }
    if (pdVar7 == (double *)0x0) {
      puVar8 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar8 = std::ostream::_M_insert<long>;
      __cxa_throw(puVar8,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    (forces->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data =
         pdVar7;
    sensorPosition2 = extraout_RDX;
  }
  (forces->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows = 3;
  bVar11 = in_R8D != 0;
  if (in_R8D == 0) {
    local_c4 = 0;
    local_b0 = 0.0;
    local_b8 = 0.0;
    local_c0 = 0.0;
    local_a8 = 0.0;
  }
  else {
    local_40 = (forces->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
               m_data;
    local_38 = (ulong)in_R8D * 6;
    uVar9 = 1;
    uVar10 = 0;
    local_a8 = 0.0;
    local_c0 = 0.0;
    local_b8 = 0.0;
    local_b0 = 0.0;
    local_c4 = 0;
    do {
      local_68 = uVar10 & 0xffffffff;
      local_88.m_data =
           (sensorPosition1->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
           m_storage.m_data + local_68;
      local_58 = (sensorPosition1->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>)
                 .m_storage.m_rows;
      local_88.m_rows = 6;
      local_88.m_cols = 1;
      local_60 = 0;
      local_70 = sensorPosition1;
      if (local_58 + -6 < (long)local_68) {
        __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                      ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                      "Eigen::Block<Eigen::Matrix<double, -1, 1>>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = -1, InnerPanel = false]"
                     );
      }
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
      PlainObjectBase<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,_1,false>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_98,
                 (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,__1,_false>_> *)
                 &local_88);
      lVar6 = local_90;
      if (local_90 == 6) {
        local_88.m_data = (double *)0x0;
        local_88.m_rows = 0;
        local_88.m_cols = 0;
        Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_88,0x10,4,4);
        if (((int)uVar9 == 2) ||
           (((int)uVar9 == 1 &&
            (Eigen::internal::
             call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::internal::assign_op<double,double>>
                       ((Matrix<double,__1,__1,_0,__1,__1> *)&local_88,local_50,&local_c5),
            uVar10 == 6)))) {
          Eigen::internal::
          call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::internal::assign_op<double,double>>
                    ((Matrix<double,__1,__1,_0,__1,__1> *)&local_88,local_48,&local_c5);
        }
        if ((local_88.m_rows < 1) || (local_88.m_cols < 1)) {
LAB_00103a85:
          __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                        "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                        "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>, Level = 1]"
                       );
        }
        if (local_90 < 1) {
LAB_00103aa4:
          __assert_fail("index >= 0 && index < size()",
                        "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0xb5,
                        "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
                       );
        }
        if (local_88.m_cols == 1) goto LAB_00103a85;
        if (local_90 == 1) goto LAB_00103aa4;
        if (local_88.m_cols < 3) goto LAB_00103a85;
        if (local_90 < 3) goto LAB_00103aa4;
        if ((local_88.m_rows == 1) || (local_88.m_rows < 3)) goto LAB_00103a85;
        dVar1 = *local_98;
        dVar2 = local_98[1];
        dVar3 = local_98[2];
        dVar12 = local_88.m_data[local_88.m_rows * 2 + 2] * dVar3 +
                 local_88.m_data[2] * dVar1 + local_88.m_data[local_88.m_rows + 2] * dVar2;
        if (0.0 < dVar12) {
          if (((local_90 == 3) || (local_90 < 5)) || (local_90 == 5)) goto LAB_00103aa4;
          if (local_88.m_cols == 3) goto LAB_00103a85;
          dVar4 = local_88.m_data[local_88.m_rows * 3 + 2];
          local_b8 = local_b8 +
                     ((local_88.m_data[local_88.m_rows * 3 + 1] * dVar12 +
                      local_88.m_data[local_88.m_rows * 2] * local_98[5] +
                      *local_88.m_data * local_98[3] +
                      local_88.m_data[local_88.m_rows] * local_98[4]) -
                     (dVar3 * local_88.m_data[local_88.m_rows * 2 + 1] +
                     dVar1 * local_88.m_data[1] + dVar2 * local_88.m_data[local_88.m_rows + 1]) *
                     dVar4);
          local_c0 = local_c0 -
                     (((local_88.m_data[local_88.m_rows * 2] * dVar3 +
                       *local_88.m_data * dVar1 + local_88.m_data[local_88.m_rows] * dVar2) * dVar4
                      + local_88.m_data[local_88.m_rows * 2 + 1] * local_98[5] +
                        local_88.m_data[1] * local_98[3] +
                        local_88.m_data[local_88.m_rows + 1] * local_98[4]) -
                     local_88.m_data[local_88.m_rows * 3] * dVar12);
          local_a8 = local_a8 + dVar12;
          local_b0 = local_b0 + dVar12 * dVar4;
        }
        free(local_88.m_data);
      }
      else {
        *local_40 = 0.0;
        local_40[1] = 0.0;
        local_40[2] = 0.0;
        local_c4 = (uint)CONCAT71((int7)((ulong)local_40 >> 8),1);
      }
      free(local_98);
      sensorPosition2 = extraout_RDX_00;
      if (lVar6 != 6) break;
      bVar11 = uVar9 < in_R8D;
      uVar10 = uVar10 + 6;
      uVar9 = uVar9 + 1;
    } while (local_38 != uVar10);
  }
  pVVar5 = local_a0;
  if (bVar11) {
    if ((local_c4 & 1) == 0) {
      free((local_a0->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
           m_data);
      sensorPosition2 = extraout_RDX_01;
    }
  }
  else {
    pdVar7 = (local_a0->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data;
    if ((local_a8 != 0.0) || (NAN(local_a8))) {
      *pdVar7 = local_c0 / local_a8;
      pdVar7[1] = local_b8 / local_a8;
      pdVar7[2] = local_b0 / local_a8;
    }
    else {
      *pdVar7 = 0.0;
      pdVar7[1] = 0.0;
      pdVar7[2] = 0.0;
    }
  }
  VVar13.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       (Index)sensorPosition2;
  VVar13.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)pVVar5;
  return (Vector)VVar13.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

Vector computeZmp(Vector & forces, Matrix & sensorPosition1, Matrix & sensorPosition2, unsigned contactNbr)
{
  double fnormal = 0;
  double sumZmpx = 0;
  double sumZmpy = 0;
  double sumZmpz = 0;
  Vector zmp;
  zmp.resize(3);

  for(unsigned int i = 0; i < contactNbr; ++i)
  {
    const Vector & f = forces.block(i * 6, 0, 6, 1);
    // Check that force is of dimension 6
    if(f.size() != 6)
    {
      zmp.fill(0.);
      return zmp;
    }

    Matrix M;
    M.resize(4, 4);
    if(i == 0)
    {
      M = sensorPosition1;
    }
    if(i == 1)
    {
      M = sensorPosition2;
    }

    double fx = M(0, 0) * f(0) + M(0, 1) * f(1) + M(0, 2) * f(2);
    double fy = M(1, 0) * f(0) + M(1, 1) * f(1) + M(1, 2) * f(2);
    double fz = M(2, 0) * f(0) + M(2, 1) * f(1) + M(2, 2) * f(2);

    if(fz > 0)
    {
      double Mx = M(0, 0) * f(3) + M(0, 1) * f(4) + M(0, 2) * f(5) + M(1, 3) * fz - M(2, 3) * fy;
      double My = M(1, 0) * f(3) + M(1, 1) * f(4) + M(1, 2) * f(5) + M(2, 3) * fx - M(0, 3) * fz;
      fnormal += fz;
      sumZmpx -= My;
      sumZmpy += Mx;
      sumZmpz += fz * M(2, 3);
    }
  }
  if(fnormal != 0)
  {
    zmp(0) = sumZmpx / fnormal;
    zmp(1) = sumZmpy / fnormal;
    zmp(2) = sumZmpz / fnormal;
  }
  else
  {
    zmp.fill(0.);
  }
  return zmp;
}